

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tiled_Image.cxx
# Opt level: O2

void __thiscall Fl_Tiled_Image::color_average(Fl_Tiled_Image *this,Fl_Color c,float i)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  undefined4 in_register_00000034;
  Fl_Image *this_00;
  
  this_00 = this->image_;
  if (this->alloc_image_ == 0) {
    iVar1 = Fl_Image::copy(this_00,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,c),in_RDX);
    this_00 = (Fl_Image *)CONCAT44(extraout_var,iVar1);
    this->image_ = this_00;
    this->alloc_image_ = 1;
  }
  (*this_00->_vptr_Fl_Image[3])(i,this_00,c);
  return;
}

Assistant:

void
Fl_Tiled_Image::color_average(Fl_Color c,	// I - Color to blend with
                              float    i) {	// I - Blend fraction
  if (!alloc_image_) {
    image_       = image_->copy();
    alloc_image_ = 1;
  }

  image_->color_average(c, i);
}